

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,Formals *formals)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer ppVar2;
  NewScopeLayer *pNVar3;
  Type *pTVar4;
  bool bVar5;
  mapped_type *pmVar6;
  runtime_error *this_00;
  pointer ppVar7;
  size_t __n;
  string *psVar8;
  string new_type_name;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  ppVar7 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar7 == ppVar2) {
      return;
    }
    pNVar3 = this->current_layer_;
    pTVar4 = ppVar7->first;
    pbVar1 = &ppVar7->second;
    std::__cxx11::string::string((string *)&local_90,(string *)pbVar1);
    Symbol::Symbol((Symbol *)&new_type_name,&local_90);
    NewScopeLayer::DeclareVariable(pNVar3,pTVar4,(Symbol *)&new_type_name);
    std::__cxx11::string::~string((string *)&new_type_name);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar4 = ppVar7->first;
    psVar8 = &pTVar4->type_name_;
    bVar5 = std::operator==(psVar8,"void");
    if (bVar5) break;
    bVar5 = std::operator!=(psVar8,"int");
    if (bVar5) {
      bVar5 = std::operator!=(psVar8,"boolean");
      if (bVar5) {
        bVar5 = std::operator!=(psVar8,"int[]");
        if (bVar5) {
          bVar5 = std::operator!=(psVar8,"boolean[]");
          if (bVar5) {
            if ((pTVar4->type_name_)._M_dataplus._M_p[(pTVar4->type_name_)._M_string_length - 1] ==
                ']') {
              new_type_name._M_dataplus._M_p = (pointer)&new_type_name.field_2;
              new_type_name._M_string_length = 0;
              new_type_name.field_2._M_local_buf[0] = '\0';
              __n = (pTVar4->type_name_)._M_string_length - 2;
              if (__n != 0) {
                memmove(new_type_name._M_dataplus._M_p,(pTVar4->type_name_)._M_dataplus._M_p,__n);
              }
              pNVar3 = this->current_layer_;
              std::__cxx11::string::string((string *)&local_70,(string *)pbVar1);
              Symbol::Symbol((Symbol *)local_50,&local_70);
              pmVar6 = std::__detail::
                       _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pNVar3->user_type_system_,(key_type *)local_50);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::~string(local_50);
              std::__cxx11::string::~string((string *)&local_70);
              psVar8 = &new_type_name;
            }
            else {
              pNVar3 = this->current_layer_;
              std::__cxx11::string::string((string *)&local_b0,(string *)pbVar1);
              Symbol::Symbol((Symbol *)&new_type_name,&local_b0);
              pmVar6 = std::__detail::
                       _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pNVar3->user_type_system_,(key_type *)&new_type_name);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::~string((string *)&new_type_name);
              psVar8 = &local_b0;
            }
            std::__cxx11::string::~string((string *)psVar8);
          }
        }
      }
    }
    ppVar7 = ppVar7 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t declare variable of void type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(Formals* formals) {
  for (auto& formal : formals->formals_) {
    current_layer_->DeclareVariable(formal.first, Symbol(formal.second));

    const std::string& type_name = formal.first->type_name_;

    if (type_name == "void") {
      throw std::runtime_error("Can't declare variable of void type");
    }

    // pre type checking to resolve class methods and fields
    if (type_name != "int" && type_name != "boolean" && type_name != "int[]" &&
        type_name != "boolean[]") {
      if (type_name.back() != ']') {
        current_layer_->user_type_system_[Symbol(formal.second)] = type_name;
      } else {
        std::string new_type_name;

        std::copy(type_name.begin(), type_name.end() - 2,
                  new_type_name.begin());

        current_layer_->user_type_system_[Symbol(formal.second)] =
            new_type_name;
      }
    }
  }
}